

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpApiRequest.cpp
# Opt level: O0

void __thiscall
xmrig::HttpApiRequest::HttpApiRequest(HttpApiRequest *this,HttpData *req,bool restricted)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  String *pSVar4;
  size_t sVar5;
  char *__s1;
  HttpData *in_RSI;
  long *in_RDI;
  undefined4 in_stack_ffffffffffffff28;
  Source in_stack_ffffffffffffff2c;
  ApiRequest *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  HttpApiResponse *in_stack_ffffffffffffff40;
  CrtAllocator *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_stack_ffffffffffffff58;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_stack_ffffffffffffff60;
  
  ApiRequest::ApiRequest
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
             SUB41((uint)in_stack_ffffffffffffff28 >> 0x18,0));
  *in_RDI = (long)&PTR__HttpApiRequest_002b77f0;
  in_RDI[6] = (long)in_RSI;
  HttpData::id(in_RSI);
  HttpApiResponse::HttpApiResponse(in_stack_ffffffffffffff40,(uint64_t)in_stack_ffffffffffffff38);
  *(undefined4 *)(in_RDI + 0x1b) = 0;
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GenericDocument(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                    CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                    in_stack_ffffffffffffff48);
  std::__cxx11::string::c_str();
  String::String((String *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  iVar3 = (**(code **)(*in_RDI + 0x58))();
  if (iVar3 == 1) {
    (**(code **)(*in_RDI + 0x48))();
    bVar1 = String::operator==((String *)in_stack_ffffffffffffff30,
                               (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)
                              );
    if (!bVar1) {
      (**(code **)(*in_RDI + 0x48))();
      bVar1 = String::operator==((String *)in_stack_ffffffffffffff30,
                                 (char *)CONCAT44(in_stack_ffffffffffffff2c,
                                                  in_stack_ffffffffffffff28));
      if (!bVar1) {
        (**(code **)(*in_RDI + 0x48))();
        bVar1 = String::operator==((String *)in_stack_ffffffffffffff30,
                                   (char *)CONCAT44(in_stack_ffffffffffffff2c,
                                                    in_stack_ffffffffffffff28));
        if (!bVar1) goto LAB_001e1b55;
      }
    }
    *(undefined4 *)((long)in_RDI + 0xc) = 1;
  }
LAB_001e1b55:
  iVar3 = (**(code **)(*in_RDI + 0x58))();
  if (iVar3 == 3) {
    (**(code **)(*in_RDI + 0x48))();
    bVar1 = String::operator==((String *)in_stack_ffffffffffffff30,
                               (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)
                              );
    if (bVar1) {
      *(undefined4 *)((long)in_RDI + 0xc) = 2;
      (**(code **)(*in_RDI + 0x10))();
      bVar2 = (**(code **)(*in_RDI + 0x18))();
      if ((bVar2 & 1) != 0) {
        (**(code **)(*in_RDI + 0x80))(in_RDI,0xffff8044);
        return;
      }
      (**(code **)(*in_RDI + 0x38))();
      Json::getString((Value *)in_stack_ffffffffffffff48,(char *)in_stack_ffffffffffffff40,
                      in_stack_ffffffffffffff38);
      String::operator=((String *)in_stack_ffffffffffffff30,
                        (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      bVar1 = String::isEmpty((String *)0x1e1c6d);
      if (!bVar1) {
        *(undefined4 *)(in_RDI + 2) = 0;
        return;
      }
      (**(code **)(*in_RDI + 0x80))(in_RDI,0xffff80a8);
      return;
    }
  }
  pSVar4 = (String *)(**(code **)(*in_RDI + 0x48))();
  sVar5 = String::size(pSVar4);
  if (4 < sVar5) {
    pSVar4 = (String *)(**(code **)(*in_RDI + 0x48))();
    __s1 = String::data(pSVar4);
    iVar3 = memcmp(__s1,"/2/",3);
    if (iVar3 == 0) {
      *(undefined4 *)(in_RDI + 1) = 2;
    }
  }
  return;
}

Assistant:

xmrig::HttpApiRequest::HttpApiRequest(const HttpData &req, bool restricted) :
    ApiRequest(SOURCE_HTTP, restricted),
    m_req(req),
    m_res(req.id()),
    m_url(req.url.c_str())
{
    if (method() == METHOD_GET) {
        if (url() == "/1/summary" || url() == "/2/summary" || url() == "/api.json") {
            m_type = REQ_SUMMARY;
        }
    }

    if (method() == METHOD_POST && url() == "/json_rpc") {
        m_type = REQ_JSON_RPC;
        accept();

        if (hasParseError()) {
            done(RPC_PARSE_ERROR);

            return;
        }

        m_rpcMethod = Json::getString(json(), "method");
        if (m_rpcMethod.isEmpty()) {
            done(RPC_INVALID_REQUEST);

            return;
        }

        m_state = STATE_NEW;

        return;
    }

    if (url().size() > 4) {
        if (memcmp(url().data(), "/2/", 3) == 0) {
            m_version = 2;
        }
    }
}